

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O2

double uprv_trunc_63(double d)

{
  double dVar1;
  
  if (0x7ff0000000000000 < (ulong)ABS(d)) {
    return NAN;
  }
  if (ABS(d) != INFINITY) {
    if (-1 < (long)d) {
      dVar1 = floor(d);
      return dVar1;
    }
    dVar1 = ceil(d);
    return dVar1;
  }
  return INFINITY;
}

Assistant:

U_CAPI double U_EXPORT2
uprv_trunc(double d)
{
#if IEEE_754
    /* handle error cases*/
    if(uprv_isNaN(d))
        return uprv_getNaN();
    if(uprv_isInfinite(d))
        return uprv_getInfinity();

    if(u_signBit(d))    /* Signbit() picks up -0.0;  d<0 does not. */
        return ceil(d);
    else
        return floor(d);

#else
    return d >= 0 ? floor(d) : ceil(d);

#endif
}